

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_latency.cpp
# Opt level: O3

void __thiscall cubeb_latency_Test::TestBody(cubeb_latency_Test *this)

{
  size_t __n;
  string *psVar1;
  undefined8 __src;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __n_00;
  cubeb *context;
  bool bVar2;
  AssertHelperData *pAVar3;
  pointer __dest;
  stringstream *this_00;
  int iVar4;
  AssertHelper AVar5;
  size_type *this_01;
  char *pcVar6;
  int r;
  AssertionResult gtest_ar;
  uint32_t preferred_rate;
  uint32_t max_channels;
  AssertionResult gtest_ar__2;
  cubeb *ctx;
  uint32_t latency_frames;
  cubeb_stream_params params;
  int local_214;
  String local_210;
  AssertHelper local_200;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f8;
  uint32_t local_1f0;
  uint32_t local_1ec;
  AssertionResult local_1e8;
  undefined1 local_1d8 [16];
  cubeb *local_1c8;
  uint32_t local_1bc;
  AssertHelper local_1b8;
  string local_1b0 [4];
  ios_base local_130 [264];
  
  local_1c8 = (cubeb *)0x0;
  local_214 = common_init(&local_1c8,"Cubeb audio test");
  if (local_214 == 0) {
    testing::AssertionSuccess();
  }
  else {
    testing::PrintToString<int>(local_1b0,&local_214);
    __n = CONCAT44(local_1b0[0]._M_string_length._4_4_,(uint32_t)local_1b0[0]._M_string_length);
    pAVar3 = (AssertHelperData *)operator_new__(__n + 1);
    memcpy(pAVar3,local_1b0[0]._M_dataplus._M_p,__n);
    *(undefined1 *)((long)&pAVar3->type + __n) = 0;
    local_210.c_str_ = (char *)pAVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0[0]._M_dataplus._M_p != &local_1b0[0].field_2) {
      operator_delete(local_1b0[0]._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
    std::ostream::_M_insert<long_long>((longlong)&local_1b0[0].field_2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base(local_130);
    __n_00.ptr_ = local_1e8.message_.ptr_;
    __src = local_1e8._0_8_;
    __dest = (pointer)operator_new__((ulong)((long)&((local_1e8.message_.ptr_)->_M_dataplus)._M_p +
                                            1));
    memcpy(__dest,(void *)__src,(size_t)__n_00.ptr_);
    __dest[(long)__n_00.ptr_] = '\0';
    local_1b0[0]._M_string_length._0_4_ = (uint32_t)__n_00.ptr_;
    local_1b0[0]._M_string_length._4_4_ = (undefined4)((ulong)__n_00.ptr_ >> 0x20);
    local_1b0[0]._M_dataplus._M_p = __dest;
    if ((AssertHelperData *)__src != (AssertHelperData *)local_1d8) {
      operator_delete((void *)__src);
    }
    testing::internal::EqFailure
              ((internal *)&local_200,"r","CUBEB_OK",&local_210,(String *)local_1b0,false);
    if (local_1b0[0]._M_dataplus._M_p != (pointer)0x0) {
      operator_delete__(local_1b0[0]._M_dataplus._M_p);
    }
    if ((AssertHelperData *)local_210.c_str_ != (AssertHelperData *)0x0) {
      operator_delete__(local_210.c_str_);
    }
  }
  if (local_200.data_._0_1_ == (internal)0x0) {
    this_00 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(this_00);
    *(undefined8 *)(this_00 + *(long *)(*(long *)(this_00 + 0x10) + -0x18) + 0x18) = 0x11;
    if (local_1f8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_1f8.ptr_)->_M_dataplus)._M_p;
    }
    local_1b0[0]._M_dataplus._M_p = (pointer)this_00;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_latency.cpp"
               ,0x12,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    if ((((stringstream *)local_1b0[0]._M_dataplus._M_p != (stringstream *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((stringstream *)local_1b0[0]._M_dataplus._M_p != (stringstream *)0x0)) {
      (**(code **)(*(long *)local_1b0[0]._M_dataplus._M_p + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_1f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  context = local_1c8;
  local_214 = cubeb_get_max_channel_count(local_1c8,&local_1ec);
  local_1b0[0]._M_dataplus._M_p._0_1_ = local_214 == -4 || local_214 == 0;
  local_1b0[0]._M_string_length._0_4_ = 0;
  local_1b0[0]._M_string_length._4_4_ = 0;
  if ((local_214 == -4) || (local_214 == 0)) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_1b0[0]._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_214 == 0) {
      local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffff00000000;
      testing::internal::CmpHelperGT<unsigned_int,unsigned_int>
                ((internal *)local_1b0,"max_channels","0u",&local_1ec,(uint *)&local_1e8);
      if ((char)local_1b0[0]._M_dataplus._M_p != '\0') {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_1b0[0]._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        goto LAB_0010753b;
      }
      pAVar3 = (AssertHelperData *)operator_new(0x188);
      std::__cxx11::stringstream::stringstream((stringstream *)pAVar3);
      *(undefined8 *)((long)&(pAVar3->message).c_str_ + *(long *)(*(long *)&pAVar3->line + -0x18)) =
           0x11;
      if ((undefined8 *)
          CONCAT44(local_1b0[0]._M_string_length._4_4_,(uint32_t)local_1b0[0]._M_string_length) ==
          (undefined8 *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)CONCAT44(local_1b0[0]._M_string_length._4_4_,
                                    (uint32_t)local_1b0[0]._M_string_length);
      }
      iVar4 = 0x1a;
      local_1e8._0_8_ = pAVar3;
LAB_00107a06:
      this_01 = &local_1b0[0]._M_string_length;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_210,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_latency.cpp"
                 ,iVar4,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_210,(Message *)&local_1e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_210);
      if (((AssertHelperData *)local_1e8._0_8_ == (AssertHelperData *)0x0) ||
         (bVar2 = testing::internal::IsTrue(true), AVar5.data_ = (AssertHelperData *)local_1e8._0_8_
         , !bVar2)) goto LAB_00107a4b;
      goto LAB_00107a3d;
    }
LAB_0010753b:
    local_214 = cubeb_get_preferred_sample_rate(local_1c8,&local_1f0);
    local_1b0[0]._M_dataplus._M_p._0_1_ = local_214 == -4 || local_214 == 0;
    local_1b0[0]._M_string_length._0_4_ = 0;
    local_1b0[0]._M_string_length._4_4_ = 0;
    if ((local_214 != -4) && (local_214 != 0)) {
      pAVar3 = (AssertHelperData *)operator_new(0x188);
      std::__cxx11::stringstream::stringstream((stringstream *)pAVar3);
      *(undefined8 *)((long)&(pAVar3->message).c_str_ + *(long *)(*(long *)&pAVar3->line + -0x18)) =
           0x11;
      local_210.c_str_ = (char *)pAVar3;
      testing::internal::GetBoolAssertionFailureMessage
                ((internal *)&local_1e8,(AssertionResult *)local_1b0,
                 "r == CUBEB_OK || r == CUBEB_ERROR_NOT_SUPPORTED","false","true");
      iVar4 = 0x1e;
      goto LAB_00107810;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_1b0[0]._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_214 == 0) {
      local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffff00000000;
      testing::internal::CmpHelperGT<unsigned_int,unsigned_int>
                ((internal *)local_1b0,"preferred_rate","0u",&local_1f0,(uint *)&local_1e8);
      if ((char)local_1b0[0]._M_dataplus._M_p == '\0') {
        pAVar3 = (AssertHelperData *)operator_new(0x188);
        std::__cxx11::stringstream::stringstream((stringstream *)pAVar3);
        *(undefined8 *)((long)&(pAVar3->message).c_str_ + *(long *)(*(long *)&pAVar3->line + -0x18))
             = 0x11;
        if ((undefined8 *)
            CONCAT44(local_1b0[0]._M_string_length._4_4_,(uint32_t)local_1b0[0]._M_string_length) ==
            (undefined8 *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)CONCAT44(local_1b0[0]._M_string_length._4_4_,
                                      (uint32_t)local_1b0[0]._M_string_length);
        }
        iVar4 = 0x20;
        local_1e8._0_8_ = pAVar3;
        goto LAB_00107a06;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_1b0[0]._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    local_1b0[0]._M_dataplus._M_p._4_4_ = local_1f0;
    local_1b0[0]._M_dataplus._M_p._0_4_ = 2;
    local_1b0[0]._M_string_length._0_4_ = local_1ec;
    local_1b0[0]._M_string_length._4_4_ = 0;
    local_1b0[0].field_2._M_allocated_capacity._0_4_ = 0;
    local_214 = cubeb_get_min_latency(local_1c8,(cubeb_stream_params *)local_1b0,&local_1bc);
    this_01 = (size_type *)&local_1e8.message_;
    local_1e8.success_ = local_214 == -4 || local_214 == 0;
    local_1e8.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((local_214 == -4) || (local_214 == 0)) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (local_214 != 0) goto LAB_00107a52;
      local_210.c_str_ = (char *)((ulong)local_210.c_str_ & 0xffffffff00000000);
      testing::internal::CmpHelperGT<unsigned_int,unsigned_int>
                ((internal *)&local_1e8,"latency_frames","0u",&local_1bc,(uint *)&local_210);
      if ((internal)local_1e8.success_ != (internal)0x0) {
        this_01 = (size_type *)&local_1e8.message_;
        goto LAB_00107a4b;
      }
      testing::Message::Message((Message *)&local_210);
      if (local_1e8.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((local_1e8.message_.ptr_)->_M_dataplus)._M_p;
      }
      psVar1 = (string *)&local_1e8;
      testing::internal::AssertHelper::AssertHelper
                (&local_200,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_latency.cpp"
                 ,0x2d,pcVar6);
      testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_210);
      testing::internal::AssertHelper::~AssertHelper(&local_200);
      goto joined_r0x00107ab7;
    }
    pAVar3 = (AssertHelperData *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream((stringstream *)pAVar3);
    *(undefined8 *)((long)&(pAVar3->message).c_str_ + *(long *)(*(long *)&pAVar3->line + -0x18)) =
         0x11;
    local_200.data_ = pAVar3;
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)&local_210,&local_1e8,"r == CUBEB_OK || r == CUBEB_ERROR_NOT_SUPPORTED",
               "false","true");
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_latency.cpp"
               ,0x2b,local_210.c_str_);
    testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    if ((AssertHelperData *)local_210.c_str_ != (AssertHelperData *)0x0) {
      operator_delete__(local_210.c_str_);
    }
    if ((local_200.data_ != (AssertHelperData *)0x0) &&
       (bVar2 = testing::internal::IsTrue(true), AVar5.data_ = local_200.data_, bVar2))
    goto LAB_00107a3d;
  }
  else {
    pAVar3 = (AssertHelperData *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream((stringstream *)pAVar3);
    *(undefined8 *)((long)&(pAVar3->message).c_str_ + *(long *)(*(long *)&pAVar3->line + -0x18)) =
         0x11;
    local_210.c_str_ = (char *)pAVar3;
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)&local_1e8,(AssertionResult *)local_1b0,
               "r == CUBEB_OK || r == CUBEB_ERROR_NOT_SUPPORTED","false","true");
    iVar4 = 0x18;
LAB_00107810:
    psVar1 = local_1b0;
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_latency.cpp"
               ,iVar4,(char *)local_1e8._0_8_);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    if ((AssertHelperData *)local_1e8._0_8_ != (AssertHelperData *)0x0) {
      operator_delete__((void *)local_1e8._0_8_);
    }
joined_r0x00107ab7:
    this_01 = (size_type *)((long)psVar1 + 8);
    if (((AssertHelperData *)local_210.c_str_ != (AssertHelperData *)0x0) &&
       (bVar2 = testing::internal::IsTrue(true), AVar5.data_ = (AssertHelperData *)local_210.c_str_,
       bVar2)) {
LAB_00107a3d:
      if (AVar5.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)AVar5.data_ + 8))();
      }
    }
  }
LAB_00107a4b:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
LAB_00107a52:
  if (context != (cubeb *)0x0) {
    cubeb_destroy(context);
  }
  return;
}

Assistant:

TEST(cubeb, latency)
{
  cubeb * ctx = NULL;
  int r;
  uint32_t max_channels;
  uint32_t preferred_rate;
  uint32_t latency_frames;

  r = common_init(&ctx, "Cubeb audio test");
  ASSERT_EQ(r, CUBEB_OK);

  std::unique_ptr<cubeb, decltype(&cubeb_destroy)>
    cleanup_cubeb_at_exit(ctx, cubeb_destroy);

  r = cubeb_get_max_channel_count(ctx, &max_channels);
  ASSERT_TRUE(r == CUBEB_OK || r == CUBEB_ERROR_NOT_SUPPORTED);
  if (r == CUBEB_OK) {
    ASSERT_GT(max_channels, 0u);
  }

  r = cubeb_get_preferred_sample_rate(ctx, &preferred_rate);
  ASSERT_TRUE(r == CUBEB_OK || r == CUBEB_ERROR_NOT_SUPPORTED);
  if (r == CUBEB_OK) {
    ASSERT_GT(preferred_rate, 0u);
  }

  cubeb_stream_params params = {
    CUBEB_SAMPLE_FLOAT32NE,
    preferred_rate,
    max_channels,
    CUBEB_LAYOUT_UNDEFINED,
    CUBEB_STREAM_PREF_NONE
  };
  r = cubeb_get_min_latency(ctx, &params, &latency_frames);
  ASSERT_TRUE(r == CUBEB_OK || r == CUBEB_ERROR_NOT_SUPPORTED);
  if (r == CUBEB_OK) {
    ASSERT_GT(latency_frames, 0u);
  }
}